

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O2

shared_ptr<chaiscript::detail::Type_Conversion_Base>
chaiscript::
make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Dynamic_Conversion_Impl<std::runtime_error,chaiscript::exception::arithmetic_error>>
          (void)

{
  Type_Conversion_Base *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> sVar1;
  
  __p = (Type_Conversion_Base *)operator_new(0x38);
  (__p->m_to).m_type_info = (type_info *)&std::runtime_error::typeinfo;
  (__p->m_to).m_bare_type_info = (type_info *)&std::runtime_error::typeinfo;
  (__p->m_to).m_flags = 0;
  (__p->m_from).m_type_info = (type_info *)&exception::arithmetic_error::typeinfo;
  (__p->m_from).m_bare_type_info = (type_info *)&exception::arithmetic_error::typeinfo;
  (__p->m_from).m_flags = 0;
  __p->_vptr_Type_Conversion_Base = (_func_int **)&PTR_convert_004834b8;
  std::__shared_ptr<chaiscript::detail::Type_Conversion_Base,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chaiscript::detail::Type_Conversion_Base,void>
            ((__shared_ptr<chaiscript::detail::Type_Conversion_Base,(__gnu_cxx::_Lock_policy)2> *)
             in_RDI,__p);
  sVar1.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (shared_ptr<chaiscript::detail::Type_Conversion_Base>)
         sVar1.
         super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<B> make_shared(Arg &&...arg) {
#ifdef CHAISCRIPT_USE_STD_MAKE_SHARED
    return std::make_shared<D>(std::forward<Arg>(arg)...);
#else
    return std::shared_ptr<B>(static_cast<B *>(new D(std::forward<Arg>(arg)...)));
#endif
  }